

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_7zip.c
# Opt level: O1

void test_extract_last_file(char *refname)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t v2;
  archive_entry *ae;
  char buff [128];
  archive_entry *local_c0;
  undefined1 local_b8 [136];
  
  extract_reference_file(refname);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                   ,L'ƶ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ʒ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ƹ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,refname,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ƺ',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ƽ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  mVar3 = archive_entry_mode(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ƾ',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname(local_c0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
             ,L'ƿ',"dir1/file1","\"dir1/file1\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  tVar5 = archive_entry_mtime(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǀ',0x15181,"86401",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_size(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǁ',0xd,"13",lVar6,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǂ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǃ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_read_next_header((archive *)a,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǆ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  mVar3 = archive_entry_mode(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǉ',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname(local_c0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
             ,L'ǈ',"file2","\"file2\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǉ',0x15181,"86401",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_size(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǌ',0x1a,"26",lVar6,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǋ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǌ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_read_next_header((archive *)a,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǐ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  mVar3 = archive_entry_mode(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǐ',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname(local_c0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
             ,L'Ǒ',"file3","\"file3\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǒ',0x15181,"86401",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_size(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǔ',0x27,"39",lVar6,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǔ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǖ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_read_next_header((archive *)a,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǘ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  mVar3 = archive_entry_mode(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǚ',0x81a4,"(AE_IFREG | 0644)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname(local_c0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
             ,L'ǚ',"file4","\"file4\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǜ',0x15181,"86401",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  lVar6 = archive_entry_size(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǜ',0x34,"52",lVar6,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǝ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǟ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  v2 = archive_read_data((archive *)a,local_b8,0x80);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǟ',0x34,"52",v2,"archive_read_data(a, buff, sizeof(buff))",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǡ',local_b8,"buff",
                      "aaaaaaaaaaaa\nbbbbbbbbbbbb\ncccccccccccc\ndddddddddddd\n",
                      "\"aaaaaaaaaaaa\\nbbbbbbbbbbbb\\ncccccccccccc\\ndddddddddddd\\n\"",0x34,"52",
                      (void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  mVar3 = archive_entry_mode(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǥ',0x41ed,"(AE_IFDIR | 0755)",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  pcVar4 = archive_entry_pathname(local_c0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
             ,L'Ǧ',"dir1/","\"dir1/\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǧ',0x2a3001,"2764801",tVar5,"archive_entry_mtime(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǩ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǩ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǫ',5,"5",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_c0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǯ',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
  iVar1 = archive_filter_code((archive *)a,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ǳ',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
  iVar1 = archive_format((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǲ',0xe0000,"ARCHIVE_FORMAT_7ZIP",(long)iVar1,"archive_format(a)",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'ǵ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_7zip.c"
                      ,L'Ƕ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void
test_extract_last_file(const char *refname)
{
	struct archive_entry *ae;
	struct archive *a;
	char buff[128];

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file1. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("dir1/file1", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(13, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	/* Verify regular file2. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(26, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	/* Verify regular file3. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("file3", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(39, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	/* Verify regular file4. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFREG | 0644), archive_entry_mode(ae));
	assertEqualString("file4", archive_entry_pathname(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(52, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
	assertEqualInt(52, archive_read_data(a, buff, sizeof(buff)));
	assertEqualMem(buff,
	    "aaaaaaaaaaaa\nbbbbbbbbbbbb\ncccccccccccc\ndddddddddddd\n", 52);

	/* Verify directory dir1. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt((AE_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualString("dir1/", archive_entry_pathname(ae));
	assertEqualInt(2764801, archive_entry_mtime(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	assertEqualInt(5, archive_file_count(a));

	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_7ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}